

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O0

void __thiscall deqp::SubcaseBase::OutputNotSupported(SubcaseBase *this,string *reason)

{
  undefined8 this_00;
  bool bVar1;
  TestContext *this_01;
  istream *piVar2;
  char *msgStr;
  string local_1f0 [8];
  string line;
  istringstream local_1c0 [8];
  istringstream tokens;
  undefined1 local_40 [8];
  string msg;
  TestLog *log;
  string *reason_local;
  SubcaseBase *this_local;
  
  this_01 = deqp::Context::getTestContext((this->super_GLWrapper).m_context);
  msg.field_2._8_8_ = tcu::TestContext::getLog(this_01);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 reason,", test will not run.");
  std::__cxx11::istringstream::istringstream(local_1c0,(string *)local_40,_S_in);
  std::__cxx11::string::string(local_1f0);
  tcu::TestLog::startSection((TestLog *)msg.field_2._8_8_,"Not supported","Reason");
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1c0,local_1f0);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    this_00 = msg.field_2._8_8_;
    if (!bVar1) break;
    msgStr = (char *)std::__cxx11::string::c_str();
    tcu::TestLog::writeMessage((TestLog *)this_00,msgStr);
  }
  tcu::TestLog::endSection((TestLog *)msg.field_2._8_8_);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::istringstream::~istringstream(local_1c0);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void SubcaseBase::OutputNotSupported(std::string reason)
{
	using tcu::TestLog;
	TestLog&		   log = m_context.getTestContext().getLog();
	std::string		   msg = reason + ", test will not run.";
	std::istringstream tokens(msg);
	std::string		   line;
	log.startSection("Not supported", "Reason");
	while (getline(tokens, line))
	{
		log.writeMessage(line.c_str());
	}
	log.endSection();
}